

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_ModelSet_clear(HTS_ModelSet *ms)

{
  HTS_ModelSet *in_RDI;
  size_t j;
  size_t i;
  ulong local_18;
  HTS_Question *in_stack_fffffffffffffff0;
  ulong uVar1;
  HTS_Window *win;
  
  if (in_RDI->hts_voice_version != (char *)0x0) {
    free(in_RDI->hts_voice_version);
  }
  if (in_RDI->stream_type != (char *)0x0) {
    free(in_RDI->stream_type);
  }
  if (in_RDI->fullcontext_format != (char *)0x0) {
    free(in_RDI->fullcontext_format);
  }
  if (in_RDI->fullcontext_version != (char *)0x0) {
    free(in_RDI->fullcontext_version);
  }
  if (in_RDI->gv_off_context != (HTS_Question *)0x0) {
    HTS_Question_clear(in_stack_fffffffffffffff0);
    free(in_RDI->gv_off_context);
  }
  if (in_RDI->option != (char **)0x0) {
    for (uVar1 = 0; uVar1 < in_RDI->num_streams; uVar1 = uVar1 + 1) {
      if (in_RDI->option[uVar1] != (char *)0x0) {
        free(in_RDI->option[uVar1]);
      }
    }
    free(in_RDI->option);
  }
  if (in_RDI->duration != (HTS_Model *)0x0) {
    for (uVar1 = 0; uVar1 < in_RDI->num_voices; uVar1 = uVar1 + 1) {
      HTS_Model_clear((HTS_Model *)ms);
    }
    free(in_RDI->duration);
  }
  if (in_RDI->window != (HTS_Window *)0x0) {
    for (win = (HTS_Window *)0x0; win < (HTS_Window *)in_RDI->num_streams;
        win = (HTS_Window *)((long)&win->size + 1)) {
      HTS_Window_clear(win);
    }
    free(in_RDI->window);
  }
  if (in_RDI->stream != (HTS_Model **)0x0) {
    for (uVar1 = 0; uVar1 < in_RDI->num_voices; uVar1 = uVar1 + 1) {
      for (local_18 = 0; local_18 < in_RDI->num_streams; local_18 = local_18 + 1) {
        HTS_Model_clear((HTS_Model *)ms);
      }
      free(in_RDI->stream[uVar1]);
    }
    HTS_free((void *)0x10b2b4);
  }
  if (in_RDI->gv != (HTS_Model **)0x0) {
    for (uVar1 = 0; uVar1 < in_RDI->num_voices; uVar1 = uVar1 + 1) {
      for (local_18 = 0; local_18 < in_RDI->num_streams; local_18 = local_18 + 1) {
        HTS_Model_clear((HTS_Model *)ms);
      }
      free(in_RDI->gv[uVar1]);
    }
    free(in_RDI->gv);
  }
  HTS_ModelSet_initialize(in_RDI);
  return;
}

Assistant:

void HTS_ModelSet_clear(HTS_ModelSet * ms)
{
   size_t i, j;

   if (ms->hts_voice_version != NULL)
      free(ms->hts_voice_version);
   if (ms->stream_type != NULL)
      free(ms->stream_type);
   if (ms->fullcontext_format != NULL)
      free(ms->fullcontext_format);
   if (ms->fullcontext_version != NULL)
      free(ms->fullcontext_version);
   if (ms->gv_off_context != NULL) {
      HTS_Question_clear(ms->gv_off_context);
      free(ms->gv_off_context);
   }
   if (ms->option != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         if (ms->option[i] != NULL)
            free(ms->option[i]);
      free(ms->option);
   }

   if (ms->duration != NULL) {
      for (i = 0; i < ms->num_voices; i++)
         HTS_Model_clear(&ms->duration[i]);
      free(ms->duration);
   }
   if (ms->window != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         HTS_Window_clear(&ms->window[i]);
      free(ms->window);
   }
   if (ms->stream != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->stream[i][j]);
         free(ms->stream[i]);
      }
      HTS_free(ms->stream);
   }
   if (ms->gv != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->gv[i][j]);
         free(ms->gv[i]);
      }
      free(ms->gv);
   }
   HTS_ModelSet_initialize(ms);
}